

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_FindAboveIntersectors(AActor *actor)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  bool bVar4;
  AActor *thing;
  CheckResult cres;
  FPortalGroupArray check;
  FMultiBlockThingsIterator it;
  AActor *local_228;
  CheckResult local_220;
  FPortalGroupArray local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  if (((actor->flags).Value & 0x1002) == 2) {
    local_1f8.data.Array = (unsigned_short *)0x0;
    local_1f8.data.Most = 0;
    local_1f8.data.Count = 0;
    local_1f8.method = 1;
    local_1f8.varused = '\0';
    local_1f8.inited = false;
    FMultiBlockThingsIterator::FMultiBlockThingsIterator(&local_1d0,&local_1f8,actor,-1.0,false);
LAB_0041be0f:
    bVar4 = FMultiBlockThingsIterator::Next(&local_1d0,&local_220);
    if (bVar4) {
      local_228 = local_220.thing;
      dVar3 = actor->radius + (local_220.thing)->radius;
      if (((ABS(((local_220.thing)->__Pos).X - local_220.Position.X) < dVar3) &&
          (ABS(((local_220.thing)->__Pos).Y - local_220.Position.Y) < dVar3)) &&
         (uVar2 = ((local_220.thing)->flags).Value, (uVar2 & 3) == 2)) {
        if ((uVar2 >> 0x14 & 1) == 0) {
          if (local_220.thing == actor) goto LAB_0041be0f;
        }
        else if ((local_220.thing == actor) || (-1 < (int)(actor->flags).Value)) goto LAB_0041be0f;
        if ((((((local_220.thing)->flags2).Value | (actor->flags2).Value) >> 0xc & 1) != 0) ||
           (((((local_220.thing)->flags3).Value | (actor->flags3).Value) >> 0xd & 1) != 0)) {
          dVar3 = ((local_220.thing)->__Pos).Z;
          dVar1 = (actor->__Pos).Z;
          if ((dVar1 < dVar3) && (dVar3 <= dVar1 + actor->Height)) {
            TArray<AActor_*,_AActor_*>::Push(&intersectors,&local_228);
          }
        }
      }
      goto LAB_0041be0f;
    }
    TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
              (&local_1d0.blockIterator.DynHash);
    TArray<unsigned_short,_unsigned_short>::~TArray(&local_1f8.data);
  }
  return;
}

Assistant:

void P_FindAboveIntersectors(AActor *actor)
{
	if (actor->flags & MF_NOCLIP)
		return;

	if (!(actor->flags & MF_SOLID))
		return;

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, actor);
	FMultiBlockThingsIterator::CheckResult cres;
	while (it.Next(&cres))
	{
		AActor *thing = cres.thing;
		double blockdist = actor->radius + thing->radius;
		if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
			continue;

		if (!(thing->flags & MF_SOLID))
		{ // Can't hit thing
			continue;
		}
		if (thing->flags & (MF_SPECIAL))
		{ // [RH] Corpses and specials don't block moves
			continue;
		}
		if (thing->flags & (MF_CORPSE))
		{ // Corpses need a few more checks
			if (!(actor->flags & MF_ICECORPSE))
				continue;
		}
		if (thing == actor)
		{ // Don't clip against self
			continue;
		}
		if (!((thing->flags2 | actor->flags2) & MF2_PASSMOBJ) && !((thing->flags3 | actor->flags3) & MF3_ISMONSTER))
		{
			// Don't bother if both things don't have MF2_PASSMOBJ set and aren't monsters.
			// These things would always block each other which in nearly every situation is 
			// not what is wanted here.
			continue;
		}
		if (thing->Z() > actor->Z() &&
			thing->Z() <= actor->Top())
		{ // Thing intersects above the base
			intersectors.Push(thing);
		}
	}
}